

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void FillDistancesPrices(CLzmaEnc *p)

{
  ushort uVar1;
  UInt32 UVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  UInt32 (*paUVar7) [64];
  UInt32 (*paUVar8) [128];
  byte bVar9;
  ulong uVar10;
  UInt32 slotPrice;
  UInt32 *dp;
  UInt32 delta;
  uint prob_1;
  uint sym_1;
  uint bit_1;
  UInt32 price_1;
  CLzmaProb *probs_1;
  UInt32 *posSlotPrices;
  uint distTableSize2;
  uint slot;
  uint prob;
  uint bit;
  uint offset;
  uint sym;
  uint m;
  UInt32 price;
  CLzmaProb *probs;
  uint base;
  uint footerBits;
  uint posSlot;
  CProbPrice *ProbPrices;
  uint lps;
  uint i;
  UInt32 tempPrices [128];
  CLzmaEnc *p_local;
  
  p->matchPriceCount = 0;
  for (ProbPrices._4_4_ = 2; ProbPrices._4_4_ < 0x40; ProbPrices._4_4_ = ProbPrices._4_4_ + 1) {
    iVar3 = (p->g_FastPos[ProbPrices._4_4_] >> 1) - 1;
    bVar9 = (byte)iVar3;
    uVar4 = (p->g_FastPos[ProbPrices._4_4_] & 1 | 2) << (bVar9 & 0x1f);
    sym = 0;
    offset = 1;
    uVar6 = ProbPrices._4_4_;
    for (; iVar3 != 0; iVar3 = iVar3 + -1) {
      uVar5 = uVar6 & 1;
      uVar6 = uVar6 >> 1;
      sym = p->ProbPrices
            [((uint)p->posEncoders[(ulong)uVar4 * 2 + (ulong)offset] ^ -uVar5 & 0x7ff) >> 4] + sym;
      offset = offset * 2 + uVar5;
    }
    uVar1 = p->posEncoders[(ulong)uVar4 * 2 + (ulong)offset];
    (&lps)[ProbPrices._4_4_ + uVar4] = sym + p->ProbPrices[uVar1 >> 4];
    (&lps)[ProbPrices._4_4_ + uVar4 + (1 << (bVar9 & 0x1f))] =
         sym + p->ProbPrices[(uVar1 ^ 0x7ff) >> 4];
  }
  for (ProbPrices._0_4_ = 0; (uint)ProbPrices < 4; ProbPrices._0_4_ = (uint)ProbPrices + 1) {
    uVar6 = p->distTableSize + 1 >> 1;
    paUVar7 = p->posSlotPrices + (uint)ProbPrices;
    uVar10 = (ulong)(uint)ProbPrices;
    for (posSlotPrices._4_4_ = 0; posSlotPrices._4_4_ < uVar6;
        posSlotPrices._4_4_ = posSlotPrices._4_4_ + 1) {
      uVar4 = posSlotPrices._4_4_ + 0x20;
      iVar3 = p->ProbPrices
              [((uint)p->posSlotEncoder[uVar10][uVar4 >> 5] ^ -(uVar4 >> 4 & 1) & 0x7ff) >> 4] +
              p->ProbPrices
              [((uint)p->posSlotEncoder[uVar10][uVar4 >> 4] ^ -(uVar4 >> 3 & 1) & 0x7ff) >> 4] +
              p->ProbPrices
              [((uint)p->posSlotEncoder[uVar10][uVar4 >> 3] ^ -(uVar4 >> 2 & 1) & 0x7ff) >> 4] +
              p->ProbPrices
              [((uint)p->posSlotEncoder[uVar10][uVar4 >> 2] ^ -(uVar4 >> 1 & 1) & 0x7ff) >> 4] +
              p->ProbPrices
              [((uint)p->posSlotEncoder[uVar10][uVar4 >> 1] ^ -(uVar4 & 1) & 0x7ff) >> 4];
      uVar1 = p->posSlotEncoder[uVar10][(ulong)posSlotPrices._4_4_ + 0x20];
      (*paUVar7)[(ulong)posSlotPrices._4_4_ * 2] = iVar3 + p->ProbPrices[uVar1 >> 4];
      (*paUVar7)[(ulong)posSlotPrices._4_4_ * 2 + 1] = iVar3 + p->ProbPrices[(uVar1 ^ 0x7ff) >> 4];
    }
    dp._4_4_ = 0x20;
    for (posSlotPrices._4_4_ = 7; posSlotPrices._4_4_ < uVar6;
        posSlotPrices._4_4_ = posSlotPrices._4_4_ + 1) {
      (*paUVar7)[(ulong)posSlotPrices._4_4_ * 2] =
           dp._4_4_ + (*paUVar7)[(ulong)posSlotPrices._4_4_ * 2];
      (*paUVar7)[(ulong)posSlotPrices._4_4_ * 2 + 1] =
           dp._4_4_ + (*paUVar7)[(ulong)posSlotPrices._4_4_ * 2 + 1];
      dp._4_4_ = dp._4_4_ + 0x10;
    }
    paUVar8 = p->distancesPrices + (uint)ProbPrices;
    (*paUVar8)[0] = (*paUVar7)[0];
    (*paUVar8)[1] = (*paUVar7)[1];
    (*paUVar8)[2] = (*paUVar7)[2];
    (*paUVar8)[3] = (*paUVar7)[3];
    for (ProbPrices._4_4_ = 4; ProbPrices._4_4_ < 0x80; ProbPrices._4_4_ = ProbPrices._4_4_ + 2) {
      UVar2 = (*paUVar7)[p->g_FastPos[ProbPrices._4_4_]];
      (*paUVar8)[ProbPrices._4_4_] = UVar2 + (&lps)[ProbPrices._4_4_];
      (*paUVar8)[ProbPrices._4_4_ + 1] = UVar2 + (&lps)[ProbPrices._4_4_ + 1];
    }
  }
  return;
}

Assistant:

Z7_NO_INLINE static void FillDistancesPrices(CLzmaEnc *p)
{
  // int y; for (y = 0; y < 100; y++) {

  UInt32 tempPrices[kNumFullDistances];
  unsigned i, lps;

  const CProbPrice *ProbPrices = p->ProbPrices;
  p->matchPriceCount = 0;

  for (i = kStartPosModelIndex / 2; i < kNumFullDistances / 2; i++)
  {
    unsigned posSlot = GetPosSlot1(i);
    unsigned footerBits = (posSlot >> 1) - 1;
    unsigned base = ((2 | (posSlot & 1)) << footerBits);
    const CLzmaProb *probs = p->posEncoders + (size_t)base * 2;
    // tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base, footerBits, i - base, p->ProbPrices);
    UInt32 price = 0;
    unsigned m = 1;
    unsigned sym = i;
    unsigned offset = (unsigned)1 << footerBits;
    base += i;
    
    if (footerBits)
    do
    {
      unsigned bit = sym & 1;
      sym >>= 1;
      price += GET_PRICEa(probs[m], bit);
      m = (m << 1) + bit;
    }
    while (--footerBits);

    {
      unsigned prob = probs[m];
      tempPrices[base         ] = price + GET_PRICEa_0(prob);
      tempPrices[base + offset] = price + GET_PRICEa_1(prob);
    }
  }

  for (lps = 0; lps < kNumLenToPosStates; lps++)
  {
    unsigned slot;
    unsigned distTableSize2 = (p->distTableSize + 1) >> 1;
    UInt32 *posSlotPrices = p->posSlotPrices[lps];
    const CLzmaProb *probs = p->posSlotEncoder[lps];
    
    for (slot = 0; slot < distTableSize2; slot++)
    {
      // posSlotPrices[slot] = RcTree_GetPrice(encoder, kNumPosSlotBits, slot, p->ProbPrices);
      UInt32 price;
      unsigned bit;
      unsigned sym = slot + (1 << (kNumPosSlotBits - 1));
      unsigned prob;
      bit = sym & 1; sym >>= 1; price  = GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      prob = probs[(size_t)slot + (1 << (kNumPosSlotBits - 1))];
      posSlotPrices[(size_t)slot * 2    ] = price + GET_PRICEa_0(prob);
      posSlotPrices[(size_t)slot * 2 + 1] = price + GET_PRICEa_1(prob);
    }
    
    {
      UInt32 delta = ((UInt32)((kEndPosModelIndex / 2 - 1) - kNumAlignBits) << kNumBitPriceShiftBits);
      for (slot = kEndPosModelIndex / 2; slot < distTableSize2; slot++)
      {
        posSlotPrices[(size_t)slot * 2    ] += delta;
        posSlotPrices[(size_t)slot * 2 + 1] += delta;
        delta += ((UInt32)1 << kNumBitPriceShiftBits);
      }
    }

    {
      UInt32 *dp = p->distancesPrices[lps];
      
      dp[0] = posSlotPrices[0];
      dp[1] = posSlotPrices[1];
      dp[2] = posSlotPrices[2];
      dp[3] = posSlotPrices[3];

      for (i = 4; i < kNumFullDistances; i += 2)
      {
        UInt32 slotPrice = posSlotPrices[GetPosSlot1(i)];
        dp[i    ] = slotPrice + tempPrices[i];
        dp[i + 1] = slotPrice + tempPrices[i + 1];
      }
    }
  }
  // }
}